

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDConstructGridGlobal.hpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
TasGrid::listToNodes<TasGrid::GridSequence>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *node_list,
          size_t num_dimensions,GridSequence *rule)

{
  difference_type dVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> nodes;
  allocator_type local_21;
  
  dVar1 = ::std::__distance<std::_Fwd_list_const_iterator<TasGrid::NodeData>>
                    ((node_list->
                     super__Fwd_list_base<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_>).
                     _M_impl._M_head._M_next,0);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)__return_storage_ptr__,
             num_dimensions * dVar1,&local_21);
  nodes._M_current =
       (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
       super__Vector_impl_data._M_start;
  while (node_list = (forward_list<TasGrid::NodeData,_std::allocator<TasGrid::NodeData>_> *)
                     ((_Fwd_list_node_base *)node_list)->_M_next,
        (_Fwd_list_impl)node_list != (_Fwd_list_impl)0x0) {
    nodes = MultiIndexManipulations::
            indexesToNodes<std::vector<int,std::allocator<int>>,TasGrid::GridSequence,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                      ((vector<int,_std::allocator<int>_> *)((long)node_list + 8),rule,nodes);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> listToNodes(std::forward_list<NodeData> const &node_list, size_t num_dimensions, RuleLike const &rule){
    std::vector<double> result(Utils::size_mult(std::distance(node_list.begin(), node_list.end()), num_dimensions));
    auto ix = result.begin();
    for(auto const &t : node_list)
        ix = MultiIndexManipulations::indexesToNodes(t.point, rule, ix);
    return result;
}